

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_originator.c
# Opt level: O0

_Bool olsrv2_originator_is_local(netaddr *addr)

{
  int iVar1;
  avl_tree *tree;
  avl_node *paVar2;
  avl_node **local_58;
  netaddr *addr_local;
  
  iVar1 = memcmp(&_originator_v4,addr,0x12);
  if (iVar1 == 0) {
    addr_local._7_1_ = true;
  }
  else {
    iVar1 = memcmp(&_originator_v6,addr,0x12);
    if (iVar1 == 0) {
      addr_local._7_1_ = true;
    }
    else {
      tree = olsrv2_originator_get_tree();
      paVar2 = avl_find(tree,addr);
      if (paVar2 == (avl_node *)0x0) {
        local_58 = (avl_node **)0x0;
      }
      else {
        local_58 = &paVar2[-1].right;
      }
      addr_local._7_1_ = local_58 != (avl_node **)0x0;
    }
  }
  return addr_local._7_1_;
}

Assistant:

bool
olsrv2_originator_is_local(const struct netaddr *addr) {
  if (netaddr_cmp(&_originator_v4, addr) == 0) {
    return true;
  }
  if (netaddr_cmp(&_originator_v6, addr) == 0) {
    return true;
  }
  return olsrv2_originator_get_entry(addr) != NULL;
}